

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(uint64_t i,Nonnull<char_*> buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint64_t uVar4;
  char *in_RSI;
  Nonnull<char_*> in_RDI;
  uint64_t mod_result;
  uint64_t mid_result;
  uint32_t div08mod08;
  uint32_t div016;
  uint64_t div08_3;
  uint32_t div08_1;
  uint32_t mod08;
  uint64_t bottom_2;
  uint32_t mod08_2;
  uint32_t div08_2;
  uint32_t zeroes_1;
  uint64_t bottom_3;
  uint64_t bottom;
  uint32_t mod08_1;
  uint32_t div08;
  uint32_t zeroes;
  uint64_t bottom_1;
  Nonnull<char_*> v;
  char *p;
  Nonnull<char_*> out_str;
  undefined8 in_stack_ffffffffffffff50;
  uint32_t n;
  uint32_t in_stack_ffffffffffffff64;
  char *local_88;
  char *local_78;
  char *local_40;
  char *local_8;
  
  n = (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  v = in_RDI;
  p = in_RSI;
  out_str = in_RDI;
  uVar3 = std::numeric_limits<unsigned_int>::max();
  if ((Nonnull<char_*>)(ulong)uVar3 < v) {
    if (in_RDI < (Nonnull<char_*>)0x2386f26fc10000) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDI;
      uVar3 = SUB164(auVar1 / ZEXT816(100000000),0);
      if (uVar3 < 10) {
        *in_RSI = SUB161(auVar1 / ZEXT816(100000000),0) + '0';
        local_40 = in_RSI + 1;
      }
      else if (uVar3 < 100000000) {
        uVar4 = anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffff64);
        if (uVar4 == 0) {
          __assert_fail("bottom != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                        ,0xf4,
                        "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                       );
        }
        uVar3 = countr_zero<unsigned_long>(uVar4);
        little_endian::Store64(p,(uint64_t)v);
        local_40 = in_RSI + (8 - (ulong)(uVar3 >> 3));
      }
      else {
        anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffff64);
        local_40 = anon_unknown_0::EncodeHundred(n,out_str);
        little_endian::Store64(p,(uint64_t)v);
        local_40 = local_40 + 8;
      }
      local_88 = local_40;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)in_RDI / 100000000;
      in_stack_ffffffffffffff64 = SUB164(auVar2 / ZEXT816(100000000),0);
      anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffff64);
      local_88 = anon_unknown_0::EncodeTenThousand(n,out_str);
      little_endian::Store64(p,(uint64_t)v);
      local_88 = local_88 + 8;
    }
    anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffff64);
    little_endian::Store64(p,(uint64_t)v);
    local_78 = local_88 + 8;
  }
  else {
    if ((uint)in_RDI < 10) {
      *in_RSI = (char)in_RDI + '0';
      local_8 = in_RSI + 1;
    }
    else if ((uint)in_RDI < 100000000) {
      uVar4 = anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffff64);
      if (uVar4 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0xf4,
                      "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar3 = countr_zero<unsigned_long>(uVar4);
      little_endian::Store64(p,(uint64_t)v);
      local_8 = in_RSI + (8 - (ulong)(uVar3 >> 3));
    }
    else {
      anon_unknown_0::PrepareEightDigits(in_stack_ffffffffffffff64);
      local_8 = anon_unknown_0::EncodeHundred(n,out_str);
      little_endian::Store64(p,(uint64_t)v);
      local_8 = local_8 + 8;
    }
    local_78 = local_8;
  }
  *local_78 = '\0';
  return local_78;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    uint64_t i, absl::Nonnull<char*> buffer) {
  buffer = EncodeFullU64(i, buffer);
  *buffer = '\0';
  return buffer;
}